

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

int __thiscall testing::internal::UnitTestImpl::skipped_test_count(UnitTestImpl *this)

{
  int iVar1;
  
  iVar1 = SumOverTestSuiteList(&this->test_suites_,0x10c760);
  return iVar1;
}

Assistant:

int UnitTestImpl::skipped_test_count() const {
  return SumOverTestSuiteList(test_suites_, &TestSuite::skipped_test_count);
}